

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

void __thiscall DataSet::normalize(DataSet *this,double beg,double end)

{
  double dVar1;
  uint uVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  double *pdVar4;
  uint j;
  uint index;
  uint index_00;
  uint i;
  ulong uVar5;
  double local_30;
  double local_28;
  
  for (uVar5 = 0; uVar5 < (this->m_inputSet).m_shape.field_0.m_dims[1]; uVar5 = uVar5 + 1) {
    local_28 = 0.0;
    local_30 = 0.0;
    for (index = 0; uVar2 = (this->m_inputSet).m_shape.field_0.m_dims[0], index < uVar2;
        index = index + 1) {
      pvVar3 = Matrix::operator[](&this->m_inputSet,index);
      if (local_30 <
          (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar5]) {
        pvVar3 = Matrix::operator[](&this->m_inputSet,index);
        local_30 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5];
      }
      pvVar3 = Matrix::operator[](&this->m_inputSet,index);
      pdVar4 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      if (*pdVar4 <= local_28 && local_28 != *pdVar4) {
        pvVar3 = Matrix::operator[](&this->m_inputSet,index);
        local_28 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5];
      }
    }
    for (index_00 = 0; index_00 < uVar2; index_00 = index_00 + 1) {
      pvVar3 = Matrix::operator[](&this->m_inputSet,index_00);
      dVar1 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      pdVar4 = Matrix::set(&this->m_inputSet,index_00,(uint)uVar5);
      *pdVar4 = (dVar1 - local_28) / (local_30 - local_28);
      uVar2 = (this->m_inputSet).m_shape.field_0.m_dims[0];
    }
  }
  return;
}

Assistant:

void DataSet::normalize(double beg, double end){
    for(uint i=0;i<m_inputSet.m_shape.n_col;++i){
        double min=0, max=0;
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            if(max<m_inputSet[j][i]) max=m_inputSet[j][i];
            if(min>m_inputSet[j][i]) min=m_inputSet[j][i];
        }
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            m_inputSet.set(j, i)=(m_inputSet[j][i]-min)/(max-min);
        }
    }
}